

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

Point __thiscall TextBuffer::Layer::position_for_offset(Layer *this,uint32_t goal_offset)

{
  uint32_t target_offset;
  bool bVar1;
  Text *this_00;
  anon_class_8_1_8991fb9c local_70;
  function<Point_(unsigned_int)> local_68;
  anon_class_8_1_8991fb9c local_48;
  function<unsigned_int_(Point)> local_40;
  uint32_t local_1c;
  Layer *pLStack_18;
  uint32_t goal_offset_local;
  Layer *this_local;
  
  local_1c = goal_offset;
  pLStack_18 = this;
  bVar1 = ::optional::operator_cast_to_bool((optional *)&this->text);
  target_offset = local_1c;
  if (bVar1) {
    this_00 = optional<Text>::operator->(&this->text);
    this_local = (Layer *)Text::position_for_offset(this_00,local_1c,0,true);
  }
  else {
    local_48.this = this;
    std::function<unsigned_int(Point)>::
    function<TextBuffer::Layer::position_for_offset(unsigned_int)const::_lambda(Point)_1_,void>
              ((function<unsigned_int(Point)> *)&local_40,&local_48);
    local_70.this = this;
    std::function<Point(unsigned_int)>::
    function<TextBuffer::Layer::position_for_offset(unsigned_int)const::_lambda(unsigned_int)_1_,void>
              ((function<Point(unsigned_int)> *)&local_68,&local_70);
    this_local = (Layer *)Patch::new_position_for_new_offset
                                    (&this->patch,target_offset,&local_40,&local_68);
    std::function<Point_(unsigned_int)>::~function(&local_68);
    std::function<unsigned_int_(Point)>::~function(&local_40);
  }
  return (Point)this_local;
}

Assistant:

Point position_for_offset(uint32_t goal_offset) const {
    if (text) {
      return text->position_for_offset(goal_offset);
    } else {
      return patch.new_position_for_new_offset(
        goal_offset,
        [this](Point old_position) {
          return previous_layer->clip_position(old_position).offset;
        },
        [this](uint32_t old_offset) {
          return previous_layer->position_for_offset(old_offset);
        }
      );
    }
  }